

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::ThrowException(BVHLoader *this,string *pError)

{
  DeadlyImportError *this_00;
  ostream *poVar1;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,(string *)&this->mFileName);
  std::operator<<((ostream *)local_198,":");
  poVar1 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_198
                      ,&this->mLine);
  std::operator<<(poVar1," - ");
  std::operator<<(poVar1,(string *)pError);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_00,&sStack_1b8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void BVHLoader::ThrowException( const std::string& pError)
{
    throw DeadlyImportError( format() << mFileName << ":" << mLine << " - " << pError);
}